

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O2

vorbis_info_residue * res0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint v;
  int iVar5;
  long *__ptr;
  long lVar6;
  vorbis_info_residue0 *info;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int local_4c;
  
  __ptr = (long *)calloc(1,0xb20);
  pvVar1 = vi->codec_setup;
  lVar6 = oggpack_read(opb,0x18);
  *__ptr = lVar6;
  lVar6 = oggpack_read(opb,0x18);
  __ptr[1] = lVar6;
  lVar6 = oggpack_read(opb,0x18);
  *(int *)(__ptr + 2) = (int)lVar6 + 1;
  lVar6 = oggpack_read(opb,6);
  uVar3 = (int)lVar6 + 1;
  *(uint *)((long)__ptr + 0x14) = uVar3;
  lVar6 = oggpack_read(opb,8);
  uVar4 = (uint)lVar6;
  *(uint *)((long)__ptr + 0x1c) = uVar4;
  if (-1 < (int)uVar4) {
    uVar9 = 0;
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    local_4c = 1;
    uVar8 = 0;
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      lVar6 = oggpack_read(opb,3);
      v = (uint)lVar6;
      lVar6 = oggpack_read(opb,1);
      if ((int)lVar6 < 0) goto LAB_001c14b6;
      if ((int)lVar6 != 0) {
        lVar6 = oggpack_read(opb,5);
        if ((int)lVar6 < 0) goto LAB_001c14b6;
        v = (int)lVar6 << 3 | v;
      }
      *(uint *)((long)__ptr + uVar9 * 4 + 0x20) = v;
      iVar5 = icount(v);
      uVar8 = uVar8 + iVar5;
    }
    uVar9 = 0;
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = uVar9;
    }
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      lVar6 = oggpack_read(opb,8);
      if ((int)lVar6 < 0) goto LAB_001c14b6;
      *(int *)((long)__ptr + uVar9 * 4 + 0x120) = (int)lVar6;
    }
    if ((int)uVar4 < *(int *)((long)pvVar1 + 0x20)) {
      uVar9 = 0;
      while (uVar7 != uVar9) {
        iVar5 = *(int *)((long)__ptr + uVar9 * 4 + 0x120);
        if ((*(int *)((long)pvVar1 + 0x20) <= iVar5) ||
           (uVar9 = uVar9 + 1,
           *(int *)(*(long *)((long)pvVar1 + (long)iVar5 * 8 + 0xb28) + 0x18) == 0))
        goto LAB_001c14b6;
      }
      piVar2 = *(int **)((long)pvVar1 + (ulong)(uVar4 & 0x7fffffff) * 8 + 0xb28);
      iVar5 = *piVar2;
      if (0 < iVar5) {
        iVar5 = iVar5 + 1;
        do {
          iVar5 = iVar5 + -1;
          if (iVar5 < 1) {
            *(int *)(__ptr + 3) = local_4c;
            return __ptr;
          }
          local_4c = local_4c * uVar3;
        } while (local_4c <= piVar2[2]);
      }
    }
  }
LAB_001c14b6:
  free(__ptr);
  return (vorbis_info_residue *)0x0;
}

Assistant:

vorbis_info_residue *res0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int j,acc=0;
  vorbis_info_residue0 *info=_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=vi->codec_setup;

  info->begin=oggpack_read(opb,24);
  info->end=oggpack_read(opb,24);
  info->grouping=oggpack_read(opb,24)+1;
  info->partitions=oggpack_read(opb,6)+1;
  info->groupbook=oggpack_read(opb,8);

  /* check for premature EOP */
  if(info->groupbook<0)goto errout;

  for(j=0;j<info->partitions;j++){
    int cascade=oggpack_read(opb,3);
    int cflag=oggpack_read(opb,1);
    if(cflag<0) goto errout;
    if(cflag){
      int c=oggpack_read(opb,5);
      if(c<0) goto errout;
      cascade|=(c<<3);
    }
    info->secondstages[j]=cascade;

    acc+=icount(cascade);
  }
  for(j=0;j<acc;j++){
    int book=oggpack_read(opb,8);
    if(book<0) goto errout;
    info->booklist[j]=book;
  }

  if(info->groupbook>=ci->books)goto errout;
  for(j=0;j<acc;j++){
    if(info->booklist[j]>=ci->books)goto errout;
    if(ci->book_param[info->booklist[j]]->maptype==0)goto errout;
  }

  /* verify the phrasebook is not specifying an impossible or
     inconsistent partitioning scheme. */
  /* modify the phrasebook ranging check from r16327; an early beta
     encoder had a bug where it used an oversized phrasebook by
     accident.  These files should continue to be playable, but don't
     allow an exploit */
  {
    int entries = ci->book_param[info->groupbook]->entries;
    int dim = ci->book_param[info->groupbook]->dim;
    int partvals = 1;
    if (dim<1) goto errout;
    while(dim>0){
      partvals *= info->partitions;
      if(partvals > entries) goto errout;
      dim--;
    }
    info->partvals = partvals;
  }

  return(info);
 errout:
  res0_free_info(info);
  return(NULL);
}